

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

bool __thiscall cmState::GetCacheEntryPropertyAsBool(cmState *this,string *key,string *propertyName)

{
  bool bVar1;
  CacheIterator local_18;
  
  local_18 = cmCacheManager::GetCacheIterator(this->CacheManager,(key->_M_dataplus)._M_p);
  bVar1 = cmCacheManager::CacheIterator::GetPropertyAsBool(&local_18,propertyName);
  return bVar1;
}

Assistant:

bool cmState::GetCacheEntryPropertyAsBool(std::string const& key,
                                          std::string const& propertyName)
{
  return this->CacheManager->GetCacheIterator(key.c_str())
    .GetPropertyAsBool(propertyName);
}